

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

void do_cmd_wiz_learn_object_kinds(command *cmd)

{
  ushort uVar1;
  object_kind *poVar2;
  _Bool _Var3;
  wchar_t wVar4;
  long lVar5;
  wchar_t level;
  char s [80];
  wchar_t local_5c;
  uint8_t *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  wVar4 = cmd_get_arg_number((command_conflict *)cmd,"level",&local_5c);
  if (wVar4 != L'\0') {
    uStack_50 = 0;
    local_18 = 0;
    uStack_10 = 0;
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = borg_temp_x + 0xa41;
    _Var3 = get_string("Learn object kinds up to level (0-100)? ",(char *)&local_58,0x50);
    if (!_Var3) {
      return;
    }
    _Var3 = get_int_from_string((char *)&local_58,&local_5c);
    if (!_Var3) {
      return;
    }
    cmd_set_arg_number((command_conflict *)cmd,"level",local_5c);
  }
  poVar2 = k_info;
  uVar1 = z_info->k_max;
  if (1 < (ulong)uVar1) {
    lVar5 = 0;
    do {
      if ((*(long *)(poVar2[1].flags + lVar5 + -0x80) != 0) &&
         (*(wchar_t *)((long)&poVar2[1].level + lVar5) <= local_5c)) {
        (&poVar2[1].aware)[lVar5] = true;
      }
      lVar5 = lVar5 + 0x2a0;
    } while ((ulong)uVar1 * 0x2a0 + -0x2a0 != lVar5);
  }
  update_player_object_knowledge(player);
  msg("You now know about many items!");
  return;
}

Assistant:

void do_cmd_wiz_learn_object_kinds(struct command *cmd)
{
	int level, i;

	if (cmd_get_arg_number(cmd, "level", &level) != CMD_OK) {
		char s[80] = "100";

		if (!get_string("Learn object kinds up to level (0-100)? ",
			s, sizeof(s))) return;
		if (!get_int_from_string(s, &level)) return;
		cmd_set_arg_number(cmd, "level", level);
	}

	/* Scan all object kinds */
	for (i = 1; i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];

		/* Induce awareness */
		if (kind && kind->name && kind->level <= level) {
			kind->aware = true;
		}
	}

	update_player_object_knowledge(player);
	msg("You now know about many items!");
}